

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void free_token(JSParseState *s,JSToken *token)

{
  int *piVar1;
  int iVar2;
  JSContext *pJVar3;
  int64_t iVar4;
  JSValueUnion JVar5;
  JSValue JVar6;
  
  iVar2 = token->val;
  if (iVar2 < -0x7c) {
    if (iVar2 + 0x7fU < 2) {
      pJVar3 = s->ctx;
      JVar5 = (JSValueUnion)*(JSValueUnion *)&token->u;
      iVar4 = (token->u).str.str.tag;
LAB_0012ec2f:
      if ((0xfffffff4 < (uint)iVar4) &&
         (iVar2 = *JVar5.ptr, *(int *)JVar5.ptr = iVar2 + -1, iVar2 < 2)) {
        JVar6.tag = iVar4;
        JVar6.u.ptr = JVar5.ptr;
        __JS_FreeValueRT(pJVar3->rt,JVar6);
      }
      return;
    }
    if (iVar2 == -0x7d) goto LAB_0012ebde;
  }
  else {
    if (iVar2 == -0x7c) {
      pJVar3 = s->ctx;
      piVar1 = *(int **)&token->u;
      JVar6 = (token->u).str.str;
      if ((0xfffffff4 < (uint)(token->u).str.str.tag) &&
         (iVar2 = *piVar1, *piVar1 = iVar2 + -1, iVar2 < 2)) {
        __JS_FreeValueRT(pJVar3->rt,JVar6);
      }
      pJVar3 = s->ctx;
      JVar5 = (JSValueUnion)((JSValueUnion *)((long)&token->u + 0x10))->ptr;
      iVar4 = (token->u).regexp.flags.tag;
      goto LAB_0012ec2f;
    }
    if (iVar2 == -0x57) goto LAB_0012ebde;
  }
  if (0x2d < iVar2 + 0x55U) {
    return;
  }
LAB_0012ebde:
  JS_FreeAtom(s->ctx,(token->u).ident.atom);
  return;
}

Assistant:

static void free_token(JSParseState *s, JSToken *token)
{
    switch(token->val) {
#ifdef CONFIG_BIGNUM
    case TOK_NUMBER:
        JS_FreeValue(s->ctx, token->u.num.val);
        break;
#endif
    case TOK_STRING:
    case TOK_TEMPLATE:
        JS_FreeValue(s->ctx, token->u.str.str);
        break;
    case TOK_REGEXP:
        JS_FreeValue(s->ctx, token->u.regexp.body);
        JS_FreeValue(s->ctx, token->u.regexp.flags);
        break;
    case TOK_IDENT:
    case TOK_PRIVATE_NAME:
        JS_FreeAtom(s->ctx, token->u.ident.atom);
        break;
    default:
        if (token->val >= TOK_FIRST_KEYWORD &&
            token->val <= TOK_LAST_KEYWORD) {
            JS_FreeAtom(s->ctx, token->u.ident.atom);
        }
        break;
    }
}